

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::layoutTypeCheck(TParseContext *this,TSourceLoc *loc,TType *type)

{
  TType *pTVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  TLayoutFormat TVar6;
  uint uVar7;
  undefined4 extraout_var;
  TQualifier *pTVar8;
  uint *puVar9;
  ulong uVar10;
  TSampler *pTVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  TString local_90;
  char *local_68;
  char *explanation;
  int lastBinding;
  int repeated_1;
  int repeated;
  bool typeCollision;
  TQualifier *local_28;
  TQualifier *qualifier;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  qualifier = (TQualifier *)type;
  type_local = (TType *)loc;
  loc_local = (TSourceLoc *)this;
  iVar4 = (*type->_vptr_TType[0xb])();
  local_28 = (TQualifier *)CONCAT44(extraout_var,iVar4);
  layoutQualifierCheck(this,(TSourceLoc *)type_local,local_28);
  bVar2 = TQualifier::hasAnyLocation(local_28);
  if (bVar2) {
    bVar2 = TQualifier::hasLocation(local_28);
    if ((((bVar2) && (((uint)*(undefined8 *)&local_28->field_0x8 & 0x7f) == 4)) &&
        ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) &&
       ((uint)(this->resources).maxDrawBuffers <=
        ((uint)*(undefined8 *)&local_28->field_0x1c & 0xfff))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"too large for fragment output","location","");
    }
    bVar2 = TQualifier::hasComponent(local_28);
    if (bVar2) {
      uVar10 = *(ulong *)&local_28->field_0x1c;
      iVar4 = (**(code **)(qualifier->semanticName + 0x60))();
      iVar5 = (**(code **)(qualifier->semanticName + 0x38))();
      iVar14 = 1;
      if (iVar5 == 2) {
        iVar14 = 2;
      }
      if (4 < (int)(((uint)(uVar10 >> 0xc) & 7) + iVar4 * iVar14)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"type overflows the available 4 components","component","");
      }
      uVar10 = (**(code **)(qualifier->semanticName + 0xe0))();
      if ((((uVar10 & 1) != 0) ||
          (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 == 0x10)) ||
         (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 == 0xf)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"cannot apply to a matrix, structure, or block","component","");
      }
      iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
      if ((iVar4 == 2) && ((*(ulong *)&local_28->field_0x1c >> 0xc & 1) != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"doubles cannot start on an odd-numbered component","component",
                   "");
      }
    }
    switch(*(uint *)&local_28->field_0x8 & 0x7f) {
    case 3:
    case 4:
      iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
      if (iVar4 == 0x10) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,(TSourceLoc *)type_local,6,0x1b8,"GL_ARB_enhanced_layouts"
                   ,"location qualifier on in/out block");
      }
      pTVar8 = (TQualifier *)(**(code **)(qualifier->semanticName + 0x58))();
      bVar2 = TQualifier::isTaskMemory(pTVar8);
      if (bVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"cannot apply to taskNV in/out blocks","location","");
      }
      break;
    case 5:
    case 6:
      iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
      if (iVar4 == 0x10) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"cannot apply to uniform or buffer block","location","");
      }
      else {
        iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
        if (iVar4 == 0xe) {
          pTVar11 = (TSampler *)(**(code **)(qualifier->semanticName + 0x40))();
          bVar2 = TSampler::isAttachmentEXT(pTVar11);
          pTVar1 = type_local;
          if (bVar2) {
            TType::getBasicTypeString_abi_cxx11_((TString *)&repeated,(TType *)qualifier);
            pcVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&repeated);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar1,"only applies to","location","%s with storage tileImageEXT",
                       pcVar12);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&repeated);
          }
        }
      }
      break;
    default:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"can only apply to uniform, buffer, in, or out storage qualifiers",
                 "location","");
      break;
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      break;
    case 0xf:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"cannot apply to taskPayloadSharedEXT","location","");
      break;
    case 0x1f:
    }
    lastBinding = TIntermediate::addUsedLocation
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_28,(TType *)qualifier,(bool *)((long)&repeated_1 + 3));
    if ((-1 < lastBinding) && ((repeated_1._3_1_ & 1) == 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"overlapping use of location","location","%d",
                 (ulong)(uint)lastBinding);
    }
    if (((repeated_1._3_1_ & 1) != 0) &&
       (((bVar2 = TQualifier::isPipeInput(local_28), bVar2 ||
         (bVar2 = TQualifier::isPipeOutput(local_28), bVar2)) ||
        (((uint)*(undefined8 *)&local_28->field_0x8 & 0x7f) == 0x1f)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"the aliases sharing the location","location",
                 "%d must be the same basic type and interpolation qualification",
                 (ulong)(uint)lastBinding);
    }
  }
  bVar2 = TQualifier::hasXfbOffset(local_28);
  if ((bVar2) && (bVar2 = TQualifier::hasXfbBuffer(local_28), bVar2)) {
    uVar10 = (**(code **)(qualifier->semanticName + 0xf8))();
    if ((uVar10 & 1) == 0) {
      explanation._4_4_ =
           TIntermediate::addXfbBufferOffset
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      (TType *)qualifier);
      if (-1 < (int)explanation._4_4_) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"overlapping offsets at","xfb_offset","offset %d in buffer %d",
                   (ulong)explanation._4_4_,(uint)*(undefined8 *)&local_28->field_0x24 & 0xf);
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"unsized array","xfb_offset","in buffer %d",
                 (ulong)((uint)*(undefined8 *)&local_28->field_0x24 & 0xf));
    }
    uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,2);
    if (((((uVar10 & 1) == 0) &&
         (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,10), (uVar10 & 1) == 0))
        && (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,0xb), (uVar10 & 1) == 0)
        ) || (bVar2 = IsMultipleOfPow2<unsigned_int>
                                ((uint)(*(ulong *)&local_28->field_0x24 >> 0x12) & 0x1fff,8), bVar2)
       ) {
      uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,0xc);
      if ((((((uVar10 & 1) == 0) &&
            (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,1), (uVar10 & 1) == 0))
           && (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,8), (uVar10 & 1) == 0
              )) && (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,9),
                    (uVar10 & 1) == 0)) ||
         (bVar2 = IsMultipleOfPow2<unsigned_int>
                            ((uint)(*(ulong *)&local_28->field_0x24 >> 0x12) & 0x1fff,4), bVar2)) {
        bVar2 = TType::contains16BitFloat((TType *)qualifier);
        if ((((bVar2) ||
             (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,6), (uVar10 & 1) != 0)
             ) || (uVar10 = (**(code **)(qualifier->semanticName + 400))(qualifier,7),
                  (uVar10 & 1) != 0)) &&
           (bVar2 = IsMultipleOfPow2<unsigned_int>
                              ((uint)(*(ulong *)&local_28->field_0x24 >> 0x12) & 0x1fff,2), !bVar2))
        {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,type_local,
                     "type contains half float or 16-bit integer; xfb_offset must be a multiple of 2"
                     ,"xfb_offset","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"must be a multiple of size of first component","xfb_offset","");
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,
                 "type contains double or 64-bit integer; xfb_offset must be a multiple of 8",
                 "xfb_offset","");
    }
  }
  bVar2 = TQualifier::hasXfbStride(local_28);
  if (((bVar2) && (bVar2 = TQualifier::hasXfbBuffer(local_28), bVar2)) &&
     (bVar2 = TIntermediate::setXfbBufferStride
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (uint)*(undefined8 *)&local_28->field_0x24 & 0xf,
                         (uint)(*(ulong *)&local_28->field_0x24 >> 4) & 0x3fff), !bVar2)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,type_local,"all stride settings must match for xfb buffer","xfb_stride","%d",
               (ulong)((uint)*(undefined8 *)&local_28->field_0x24 & 0xf));
  }
  bVar2 = TQualifier::hasBinding(local_28);
  if (bVar2) {
    uVar10 = (**(code **)(qualifier->semanticName + 0x140))();
    if ((((uVar10 & 1) == 0) &&
        (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 != 0x10)) &&
       (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 != 0x1a)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"requires block, or sampler/image, or atomic-counter type",
                 "binding","");
    }
    iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
    if (iVar4 == 0xe) {
      explanation._0_4_ = (uint)((ulong)*(undefined8 *)&local_28->field_0x1c >> 0x20) & 0xffff;
      uVar10 = (**(code **)(qualifier->semanticName + 0xe8))();
      if (((uVar10 & 1) != 0) &&
         ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0)) {
        uVar10 = (**(code **)(qualifier->semanticName + 0xf0))();
        if ((uVar10 & 1) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,type_local,
                     "assuming binding count of one for compile-time checking of binding numbers for unsized array"
                     ,"[]","");
        }
        else {
          iVar4 = (**(code **)(qualifier->semanticName + 0x88))();
          explanation._0_4_ = iVar4 + -1 + (uint)explanation;
        }
      }
      pTVar1 = type_local;
      if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0) &&
         ((this->resources).maxCombinedTextureImageUnits <= (int)(uint)explanation)) {
        bVar3 = (**(code **)(qualifier->semanticName + 0xe8))();
        pcVar12 = "";
        if ((bVar3 & 1) != 0) {
          pcVar12 = "(using array)";
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"sampler binding not less than gl_MaxCombinedTextureImageUnits",
                   "binding",pcVar12);
      }
    }
    bVar2 = TType::isAtomic((TType *)qualifier);
    if (((bVar2) &&
        (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) == 0))
       && ((uint)(this->resources).maxAtomicCounterBindings <=
           ((uint)((ulong)*(undefined8 *)&local_28->field_0x1c >> 0x20) & 0xffff))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"atomic_uint binding is too large; see gl_MaxAtomicCounterBindings"
                 ,"binding","");
      return;
    }
  }
  else {
    bVar2 = TIntermediate::getAutoMapBindings
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if (!bVar2) {
      bVar2 = TType::isAtomic((TType *)qualifier);
      if (bVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,type_local,"layout(binding=X) is required","atomic_uint","");
      }
      if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) &&
         (bVar2 = TQualifier::isUniformOrBuffer(local_28), bVar2)) {
        iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
        if (((iVar4 != 0x10) ||
            ((bVar2 = TQualifier::isPushConstant(local_28), bVar2 ||
             (bVar2 = TQualifier::isShaderRecord(local_28), bVar2)))) ||
           ((bVar2 = TQualifier::hasAttachment(local_28), bVar2 ||
            (bVar2 = TQualifier::hasBufferReference(local_28), bVar2)))) {
          if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
             (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 == 0xe)) {
            pTVar11 = (TSampler *)(**(code **)(qualifier->semanticName + 0x40))();
            bVar2 = TSampler::isAttachmentEXT(pTVar11);
            if (!bVar2) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,type_local,"sampler/texture/image requires layout(binding=X)",
                         "binding","");
            }
          }
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,type_local,"uniform/buffer blocks require layout(binding=X)","binding","")
          ;
        }
      }
    }
  }
  bVar2 = TType::isArrayOfArrays((TType *)qualifier);
  if ((bVar2) && (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan)) {
    uVar10 = (**(code **)(qualifier->semanticName + 0x140))();
    if ((uVar10 & 1) == 0) {
      pTVar8 = (TQualifier *)(**(code **)(qualifier->semanticName + 0x58))();
      bVar2 = TQualifier::isUniformOrBuffer(pTVar8);
      if ((!bVar2) || (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 != 0x10))
      goto LAB_0069abca;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,type_local,
               "Generating SPIR-V array-of-arrays, but Vulkan only supports single array level for this resource"
               ,"[][]","");
  }
LAB_0069abca:
  bVar2 = TQualifier::hasOffset(local_28);
  if ((bVar2) && (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 == 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,type_local,"only applies to block members, not blocks","offset","");
  }
  bVar2 = TQualifier::hasFormat(local_28);
  if (bVar2) {
    uVar10 = (**(code **)(qualifier->semanticName + 0x158))();
    if (((uVar10 & 1) != 0) ||
       (bVar2 = TIntermediate::getBindlessImageMode
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate),
       pTVar1 = type_local, bVar2)) {
      puVar9 = (uint *)(**(code **)(qualifier->semanticName + 0x40))();
      if (((*puVar9 & 0xff) == 1) &&
         (TVar6 = TQualifier::getFormat(local_28), pTVar1 = type_local, 0x16 < (int)TVar6)) {
        TVar6 = TQualifier::getFormat(local_28);
        pcVar12 = TQualifier::getLayoutFormatString(TVar6);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"does not apply to floating point images",pcVar12,"");
      }
      puVar9 = (uint *)(**(code **)(qualifier->semanticName + 0x40))();
      if (((*puVar9 & 0xff) == 8) &&
         ((TVar6 = TQualifier::getFormat(local_28), (int)TVar6 < 0x16 ||
          (TVar6 = TQualifier::getFormat(local_28), 0x22 < (int)TVar6)))) {
        pTVar1 = type_local;
        TVar6 = TQualifier::getFormat(local_28);
        pcVar12 = TQualifier::getLayoutFormatString(TVar6);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"does not apply to signed integer images",pcVar12,"");
      }
      puVar9 = (uint *)(**(code **)(qualifier->semanticName + 0x40))();
      if (((*puVar9 & 0xff) == 9) &&
         (TVar6 = TQualifier::getFormat(local_28), pTVar1 = type_local, (int)TVar6 < 0x22)) {
        TVar6 = TQualifier::getFormat(local_28);
        pcVar12 = TQualifier::getLayoutFormatString(TVar6);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"does not apply to unsigned integer images",pcVar12,"");
      }
      bVar2 = TParseVersions::isEsProfile((TParseVersions *)this);
      if (((((bVar2) && (TVar6 = TQualifier::getFormat(local_28), TVar6 != ElfR32f)) &&
           (TVar6 = TQualifier::getFormat(local_28), TVar6 != ElfR32i)) &&
          ((TVar6 = TQualifier::getFormat(local_28), TVar6 != ElfR32ui &&
           (bVar2 = TQualifier::isReadOnly(local_28), !bVar2)))) &&
         (bVar2 = TQualifier::isWriteOnly(local_28), pTVar1 = type_local, !bVar2)) {
        TVar6 = TQualifier::getFormat(local_28);
        pcVar12 = TQualifier::getLayoutFormatString(TVar6);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"format requires readonly or writeonly memory qualifier",pcVar12,"");
      }
    }
    else {
      TVar6 = TQualifier::getFormat(local_28);
      pcVar12 = TQualifier::getLayoutFormatString(TVar6);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar1,"only apply to images",pcVar12,"");
    }
  }
  else {
    uVar10 = (**(code **)(qualifier->semanticName + 0x158))();
    if ((((uVar10 & 1) != 0) && (bVar2 = TQualifier::isWriteOnly(local_28), !bVar2)) &&
       (bVar2 = TIntermediate::getBindlessImageMode
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate),
       !bVar2)) {
      local_68 = "image variables not declared \'writeonly\' and without a format layout qualifier";
      TParseVersions::requireProfile
                ((TParseVersions *)this,(TSourceLoc *)type_local,6,
                 "image variables not declared \'writeonly\' and without a format layout qualifier")
      ;
      TParseVersions::profileRequires
                ((TParseVersions *)this,(TSourceLoc *)type_local,6,0,
                 "GL_EXT_shader_image_load_formatted",local_68);
    }
  }
  bVar2 = TQualifier::isPushConstant(local_28);
  if (bVar2) {
    iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
    if (iVar4 != 0x10) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"can only be used with a block","push_constant","");
    }
    uVar10 = (**(code **)(qualifier->semanticName + 0xe8))();
    if ((uVar10 & 1) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"Push constants blocks can\'t be an array","push_constant","");
    }
  }
  iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
  if (iVar4 == 0x12) {
    bVar2 = TQualifier::isPipeInput(local_28);
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"cannot contain any structs with buffer_reference.","in",
                 "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead."
                );
    }
    bVar2 = TQualifier::isPipeOutput(local_28);
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"cannot contain any structs with buffer_reference.","out",
                 "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead."
                );
    }
  }
  bVar2 = TQualifier::hasBufferReference(local_28);
  if ((bVar2) && (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 != 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,type_local,"can only be used with a block","buffer_reference","");
  }
  bVar2 = TQualifier::isShaderRecord(local_28);
  if ((bVar2) && (iVar4 = (**(code **)(qualifier->semanticName + 0x38))(), iVar4 != 0x10)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,type_local,"can only be used with a block","shaderRecordNV","");
  }
  uVar10 = (**(code **)(qualifier->semanticName + 0x160))();
  if ((uVar10 & 1) == 0) {
    bVar2 = TQualifier::hasAttachment(local_28);
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"can only be used with a subpass","input_attachment_index","");
    }
  }
  else {
    uVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_tile_image");
    pTVar1 = type_local;
    if ((uVar7 & 1) != 0) {
      pTVar11 = (TSampler *)(**(code **)(qualifier->semanticName + 0x40))();
      TSampler::getString_abi_cxx11_(&local_90,pTVar11);
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (&local_90);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar1,"cannot be used with GL_EXT_shader_tile_image enabled",pcVar12,"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_90);
    }
    bVar2 = TQualifier::hasAttachment(local_28);
    if (!bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"requires an input_attachment_index layout qualifier","subpass","")
      ;
    }
  }
  bVar2 = TQualifier::hasSpecConstantId(local_28);
  if (bVar2) {
    lVar13 = (**(code **)(qualifier->semanticName + 0x58))();
    if (((uint)*(undefined8 *)(lVar13 + 8) & 0x7f) != 2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"can only be applied to \'const\'-qualified scalar","constant_id",
                 "");
    }
    uVar10 = (**(code **)(qualifier->semanticName + 0xc0))();
    if ((uVar10 & 1) == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"can only be applied to a scalar","constant_id","");
    }
    iVar4 = (**(code **)(qualifier->semanticName + 0x38))();
    if (0xb < iVar4 - 1U) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,type_local,"cannot be applied to this type","constant_id","");
    }
  }
  return;
}

Assistant:

void TParseContext::layoutTypeCheck(const TSourceLoc& loc, const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    // first, intra-layout qualifier-only error checking
    layoutQualifierCheck(loc, qualifier);

    // now, error checking combining type and qualifier

    if (qualifier.hasAnyLocation()) {
        if (qualifier.hasLocation()) {
            if (qualifier.storage == EvqVaryingOut && language == EShLangFragment) {
                if (qualifier.layoutLocation >= (unsigned int)resources.maxDrawBuffers)
                    error(loc, "too large for fragment output", "location", "");
            }
        }
        if (qualifier.hasComponent()) {
            // "It is a compile-time error if this sequence of components gets larger than 3."
            if (qualifier.layoutComponent + type.getVectorSize() * (type.getBasicType() == EbtDouble ? 2 : 1) > 4)
                error(loc, "type overflows the available 4 components", "component", "");

            // "It is a compile-time error to apply the component qualifier to a matrix, a structure, a block, or an array containing any of these."
            if (type.isMatrix() || type.getBasicType() == EbtBlock || type.getBasicType() == EbtStruct)
                error(loc, "cannot apply to a matrix, structure, or block", "component", "");

            // " It is a compile-time error to use component 1 or 3 as the beginning of a double or dvec2."
            if (type.getBasicType() == EbtDouble)
                if (qualifier.layoutComponent & 1)
                    error(loc, "doubles cannot start on an odd-numbered component", "component", "");
        }

        switch (qualifier.storage) {
        case EvqVaryingIn:
        case EvqVaryingOut:
            if (type.getBasicType() == EbtBlock)
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, "location qualifier on in/out block");
            if (type.getQualifier().isTaskMemory())
                error(loc, "cannot apply to taskNV in/out blocks", "location", "");
            break;
        case EvqUniform:
        case EvqBuffer:
            if (type.getBasicType() == EbtBlock)
                error(loc, "cannot apply to uniform or buffer block", "location", "");
            else if (type.getBasicType() == EbtSampler && type.getSampler().isAttachmentEXT())
                error(loc, "only applies to", "location", "%s with storage tileImageEXT", type.getBasicTypeString().c_str());
            break;
        case EvqtaskPayloadSharedEXT:
            error(loc, "cannot apply to taskPayloadSharedEXT", "location", "");
            break;
        case EvqPayload:
        case EvqPayloadIn:
        case EvqHitAttr:
        case EvqCallableData:
        case EvqCallableDataIn:
        case EvqHitObjectAttrNV:
        case EvqSpirvStorageClass:
            break;
        case EvqTileImageEXT:
            break;
        default:
            error(loc, "can only apply to uniform, buffer, in, or out storage qualifiers", "location", "");
            break;
        }

        bool typeCollision;
        int repeated = intermediate.addUsedLocation(qualifier, type, typeCollision);
        if (repeated >= 0 && ! typeCollision)
            error(loc, "overlapping use of location", "location", "%d", repeated);
        // When location aliasing, the aliases sharing the location must have the same underlying numerical type and bit width(
        // floating - point or integer, 32 - bit versus 64 - bit,etc.)
        if (typeCollision && (qualifier.isPipeInput() || qualifier.isPipeOutput() || qualifier.storage == EvqTileImageEXT))
            error(loc, "the aliases sharing the location", "location", "%d must be the same basic type and interpolation qualification", repeated);
    }

    if (qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()) {
        if (type.isUnsizedArray()) {
            error(loc, "unsized array", "xfb_offset", "in buffer %d", qualifier.layoutXfbBuffer);
        } else {
            int repeated = intermediate.addXfbBufferOffset(type);
            if (repeated >= 0)
                error(loc, "overlapping offsets at", "xfb_offset", "offset %d in buffer %d", repeated, qualifier.layoutXfbBuffer);
        }

        // "The offset must be a multiple of the size of the first component of the first
        // qualified variable or block member, or a compile-time error results. Further, if applied to an aggregate
        // containing a double or 64-bit integer, the offset must also be a multiple of 8..."
        if ((type.containsBasicType(EbtDouble) || type.containsBasicType(EbtInt64) || type.containsBasicType(EbtUint64)) &&
            ! IsMultipleOfPow2(qualifier.layoutXfbOffset, 8))
            error(loc, "type contains double or 64-bit integer; xfb_offset must be a multiple of 8", "xfb_offset", "");
        else if ((type.containsBasicType(EbtBool) || type.containsBasicType(EbtFloat) ||
                  type.containsBasicType(EbtInt) || type.containsBasicType(EbtUint)) &&
                 ! IsMultipleOfPow2(qualifier.layoutXfbOffset, 4))
            error(loc, "must be a multiple of size of first component", "xfb_offset", "");
        // ..., if applied to an aggregate containing a half float or 16-bit integer, the offset must also be a multiple of 2..."
        else if ((type.contains16BitFloat() || type.containsBasicType(EbtInt16) || type.containsBasicType(EbtUint16)) &&
                 !IsMultipleOfPow2(qualifier.layoutXfbOffset, 2))
            error(loc, "type contains half float or 16-bit integer; xfb_offset must be a multiple of 2", "xfb_offset", "");
    }
    if (qualifier.hasXfbStride() && qualifier.hasXfbBuffer()) {
        if (! intermediate.setXfbBufferStride(qualifier.layoutXfbBuffer, qualifier.layoutXfbStride))
            error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d", qualifier.layoutXfbBuffer);
    }

    if (qualifier.hasBinding()) {
        // Binding checking, from the spec:
        //
        // "If the binding point for any uniform or shader storage block instance is less than zero, or greater than or
        // equal to the implementation-dependent maximum number of uniform buffer bindings, a compile-time
        // error will occur. When the binding identifier is used with a uniform or shader storage block instanced as
        // an array of size N, all elements of the array from binding through binding + N - 1 must be within this
        // range."
        //
        if (!type.isOpaque() && type.getBasicType() != EbtBlock && type.getBasicType() != EbtSpirvType)
            error(loc, "requires block, or sampler/image, or atomic-counter type", "binding", "");
        if (type.getBasicType() == EbtSampler) {
            int lastBinding = qualifier.layoutBinding;
            if (type.isArray()) {
                if (spvVersion.vulkan == 0) {
                    if (type.isSizedArray())
                        lastBinding += (type.getCumulativeArraySize() - 1);
                    else {
                        warn(loc, "assuming binding count of one for compile-time checking of binding numbers for unsized array", "[]", "");
                    }
                }
            }
            if (spvVersion.vulkan == 0 && lastBinding >= resources.maxCombinedTextureImageUnits)
                error(loc, "sampler binding not less than gl_MaxCombinedTextureImageUnits", "binding", type.isArray() ? "(using array)" : "");
        }
        if (type.isAtomic() && !spvVersion.vulkanRelaxed) {
            if (qualifier.layoutBinding >= (unsigned int)resources.maxAtomicCounterBindings) {
                error(loc, "atomic_uint binding is too large; see gl_MaxAtomicCounterBindings", "binding", "");
                return;
            }
        }
    } else if (!intermediate.getAutoMapBindings()) {
        // some types require bindings

        // atomic_uint
        if (type.isAtomic())
            error(loc, "layout(binding=X) is required", "atomic_uint", "");

        // SPIR-V
        if (spvVersion.spv > 0) {
            if (qualifier.isUniformOrBuffer()) {
                if (type.getBasicType() == EbtBlock && !qualifier.isPushConstant() &&
                       !qualifier.isShaderRecord() &&
                       !qualifier.hasAttachment() &&
                       !qualifier.hasBufferReference())
                    error(loc, "uniform/buffer blocks require layout(binding=X)", "binding", "");
                else if (spvVersion.vulkan > 0 && type.getBasicType() == EbtSampler && !type.getSampler().isAttachmentEXT())
                    error(loc, "sampler/texture/image requires layout(binding=X)", "binding", "");
            }
        }
    }

    // some things can't have arrays of arrays
    if (type.isArrayOfArrays()) {
        if (spvVersion.vulkan > 0) {
            if (type.isOpaque() || (type.getQualifier().isUniformOrBuffer() && type.getBasicType() == EbtBlock))
                warn(loc, "Generating SPIR-V array-of-arrays, but Vulkan only supports single array level for this resource", "[][]", "");
        }
    }

    // "The offset qualifier can only be used on block members of blocks..."
    if (qualifier.hasOffset()) {
        if (type.getBasicType() == EbtBlock)
            error(loc, "only applies to block members, not blocks", "offset", "");
    }

    // Image format
    if (qualifier.hasFormat()) {
        if (! type.isImage() && !intermediate.getBindlessImageMode())
            error(loc, "only apply to images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
        else {
            if (type.getSampler().type == EbtFloat && qualifier.getFormat() > ElfFloatGuard)
                error(loc, "does not apply to floating point images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
            if (type.getSampler().type == EbtInt && (qualifier.getFormat() < ElfFloatGuard || qualifier.getFormat() > ElfIntGuard))
                error(loc, "does not apply to signed integer images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
            if (type.getSampler().type == EbtUint && qualifier.getFormat() < ElfIntGuard)
                error(loc, "does not apply to unsigned integer images", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");

            if (isEsProfile()) {
                // "Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui, image variables must
                // specify either memory qualifier readonly or the memory qualifier writeonly."
                if (! (qualifier.getFormat() == ElfR32f || qualifier.getFormat() == ElfR32i || qualifier.getFormat() == ElfR32ui)) {
                    if (! qualifier.isReadOnly() && ! qualifier.isWriteOnly())
                        error(loc, "format requires readonly or writeonly memory qualifier", TQualifier::getLayoutFormatString(qualifier.getFormat()), "");
                }
            }
        }
    } else if (type.isImage() && ! qualifier.isWriteOnly() && !intermediate.getBindlessImageMode()) {
        const char *explanation = "image variables not declared 'writeonly' and without a format layout qualifier";
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, explanation);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 0, E_GL_EXT_shader_image_load_formatted, explanation);
    }

    if (qualifier.isPushConstant()) {
        if (type.getBasicType() != EbtBlock)
            error(loc, "can only be used with a block", "push_constant", "");
        if (type.isArray())
            error(loc, "Push constants blocks can't be an array", "push_constant", "");
    }

    if (type.getBasicType() == EbtReference) {
        if (qualifier.isPipeInput())
            error(loc, "cannot contain any structs with buffer_reference.", "in",
                  "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead.");
        if (qualifier.isPipeOutput())
            error(loc, "cannot contain any structs with buffer_reference.", "out",
                  "If you want to interface shader stages with a buffer_reference cast to a uint64 or uvec2 instead.");
    }

    if (qualifier.hasBufferReference() && type.getBasicType() != EbtBlock)
        error(loc, "can only be used with a block", "buffer_reference", "");

    if (qualifier.isShaderRecord() && type.getBasicType() != EbtBlock)
        error(loc, "can only be used with a block", "shaderRecordNV", "");

    // input attachment
    if (type.isSubpass()) {
        if (extensionTurnedOn(E_GL_EXT_shader_tile_image))
            error(loc, "cannot be used with GL_EXT_shader_tile_image enabled", type.getSampler().getString().c_str(),
                  "");
        if (! qualifier.hasAttachment())
            error(loc, "requires an input_attachment_index layout qualifier", "subpass", "");
    } else {
        if (qualifier.hasAttachment())
            error(loc, "can only be used with a subpass", "input_attachment_index", "");
    }

    // specialization-constant id
    if (qualifier.hasSpecConstantId()) {
        if (type.getQualifier().storage != EvqConst)
            error(loc, "can only be applied to 'const'-qualified scalar", "constant_id", "");
        if (! type.isScalar())
            error(loc, "can only be applied to a scalar", "constant_id", "");
        switch (type.getBasicType())
        {
        case EbtInt8:
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtInt:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
        case EbtBool:
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            break;
        default:
            error(loc, "cannot be applied to this type", "constant_id", "");
            break;
        }
    }
}